

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iso8601.c
# Opt level: O2

_Bool get_tok(char *terminals,char **ptr,int32_t *remaining,char **out,int32_t *out_len)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (*remaining == 0) {
    *out = "";
  }
  pcVar6 = *ptr;
  *out = pcVar6;
  iVar4 = -1;
  bVar3 = false;
  do {
    *out_len = iVar4;
    iVar2 = *remaining;
    if ((iVar2 == 0) || (pcVar5 = terminals, bVar3)) {
      if (bVar3 == false) {
        *out_len = iVar4 + 1;
      }
      return bVar3;
    }
    do {
      cVar1 = *pcVar5;
      bVar3 = cVar1 != '\0';
      if (cVar1 == '\0') break;
      pcVar5 = pcVar5 + 1;
    } while (*pcVar6 != cVar1);
    pcVar6 = pcVar6 + 1;
    *ptr = pcVar6;
    *remaining = iVar2 + -1;
    iVar4 = *out_len + 1;
  } while( true );
}

Assistant:

static bool
get_tok (const char *terminals,
         const char **ptr,
         int32_t *remaining,
         const char **out,
         int32_t *out_len)
{
   const char *terminal;
   bool found_terminal = false;

   if (!*remaining) {
      *out = "";
      *out_len = 0;
   }

   *out = *ptr;
   *out_len = -1;

   for (; *remaining && !found_terminal;
        (*ptr)++, (*remaining)--, (*out_len)++) {
      for (terminal = terminals; *terminal; terminal++) {
         if (**ptr == *terminal) {
            found_terminal = true;
            break;
         }
      }
   }

   if (!found_terminal) {
      (*out_len)++;
   }

   return found_terminal;
}